

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false>::set_use_fast_tape
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false> *this)

{
  bool bVar1;
  byte bVar2;
  byte local_11;
  ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false> *this_local;
  
  local_11 = 0;
  if (((this->tape_player_is_sleeping_ & 1U) == 0) &&
     (local_11 = 0, (this->allow_fast_tape_ & 1U) != 0)) {
    bVar1 = Storage::Tape::TapePlayer::has_tape(&(this->tape_player_).super_TapePlayer);
    local_11 = 0;
    if ((bVar1) && (local_11 = 0, (this->primary_slots_ & 3) == 0)) {
      bVar2 = PrimarySlot::secondary_paging(&this->memory_slots_[0].super_PrimarySlot);
      local_11 = (bVar2 & 3) != 0 ^ 0xff;
    }
  }
  this->use_fast_tape_ = (bool)(local_11 & 1);
  return;
}

Assistant:

void set_use_fast_tape() {
			use_fast_tape_ =
				!tape_player_is_sleeping_ &&
				allow_fast_tape_ &&
				tape_player_.has_tape() &&
				!(primary_slots_ & 3) &&
				!(memory_slots_[0].secondary_paging() & 3);
		}